

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall
re2::Compiler::CachedRuneByteSuffix(Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  int iVar3;
  _Hash_node_base *p_Var4;
  mapped_type *pmVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint64_t key;
  _Hash_node_base *local_30;
  
  uVar7 = CONCAT71(in_register_00000011,hi) & 0xffffffff;
  local_30 = (_Hash_node_base *)
             (CONCAT71(in_register_00000009,foldcase) & 0xffffffff |
             ((ulong)(uint)((int)CONCAT71(in_register_00000031,lo) << 9) | (long)next << 0x11) +
             uVar7 * 2);
  uVar1 = (this->rune_cache_)._M_h._M_bucket_count;
  uVar6 = (ulong)local_30 % uVar1;
  p_Var2 = (this->rune_cache_)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var2->_M_nxt, p_Var8 = p_Var2, local_30 != p_Var9[1]._M_nxt)) {
    while (p_Var4 = p_Var9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var9, p_Var9 = p_Var4, local_30 == p_Var4[1]._M_nxt)) goto LAB_001b1941;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_001b1941:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var8->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    iVar3 = UncachedRuneByteSuffix(this,lo,(uint8_t)uVar7,foldcase,next);
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->rune_cache_,(key_type *)&local_30);
    *pmVar5 = iVar3;
  }
  else {
    iVar3 = *(int *)&p_Var4[2]._M_nxt;
  }
  return iVar3;
}

Assistant:

int Compiler::CachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                   int next) {
  uint64_t key = MakeRuneCacheKey(lo, hi, foldcase, next);
  std::unordered_map<uint64_t, int>::const_iterator it = rune_cache_.find(key);
  if (it != rune_cache_.end())
    return it->second;
  int id = UncachedRuneByteSuffix(lo, hi, foldcase, next);
  rune_cache_[key] = id;
  return id;
}